

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O0

pair<unsigned_long,_unsigned_long>
libtest::unit_test<libtest::a_plus_b>::test<(anonymous_namespace)::ac>
          (usize small_gen_num,usize large_gen_num)

{
  bool bVar1;
  path *__p;
  directory_iterator *in_RCX;
  directory_iterator **local_a08;
  directory_iterator **local_9f8;
  directory_iterator **local_9e8;
  undefined1 local_9d8 [8];
  path input_file_path_2;
  usize index_1;
  path input_file_path_1;
  usize index;
  path local_950;
  undefined1 local_928 [8];
  path input_file_path;
  directory_entry *file;
  directory_iterator local_8f0;
  undefined1 local_8e0 [8];
  directory_iterator __end3;
  undefined1 local_8c0 [8];
  directory_iterator __begin3;
  directory_iterator local_888;
  directory_iterator *local_878;
  directory_iterator *__range3;
  usize failed;
  usize passed;
  ofstream solution_output_file;
  undefined1 local_660 [8];
  ifstream solution_output_file_in;
  undefined1 local_448 [8];
  ifstream generated_output_file;
  undefined1 local_240 [8];
  ifstream input_file;
  usize large_gen_num_local;
  usize small_gen_num_local;
  
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x24,"[----------] ");
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x100000025,"Run tests\n");
  std::ifstream::ifstream(local_240);
  std::ifstream::ifstream(local_448);
  std::ifstream::ifstream(local_660);
  std::ofstream::ofstream(&passed);
  failed = 0;
  __range3 = (directory_iterator *)0x0;
  test_case_dir_abi_cxx11_();
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_888,(path *)&__begin3._M_dir._M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&__begin3._M_dir._M_refcount);
  local_878 = &local_888;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end3._M_dir._M_refcount,local_878);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_8c0,(directory_iterator *)&__end3._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end3._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_8f0,local_878);
  std::filesystem::__cxx11::end((directory_iterator *)local_8e0);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_8f0);
  while (bVar1 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_8c0,(directory_iterator *)local_8e0), bVar1)
  {
    input_file_path._32_8_ =
         std::filesystem::__cxx11::directory_iterator::operator*((directory_iterator *)local_8c0);
    __p = std::filesystem::__cxx11::directory_entry::path((directory_entry *)input_file_path._32_8_)
    ;
    std::filesystem::__cxx11::path::path((path *)local_928,__p);
    std::filesystem::__cxx11::path::extension(&local_950,(path *)local_928);
    std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
              ((path *)&index,(char (*) [4])".in",auto_format);
    bVar1 = std::filesystem::__cxx11::operator!=(&local_950,(path *)&index);
    std::filesystem::__cxx11::path::~path((path *)&index);
    std::filesystem::__cxx11::path::~path(&local_950);
    if (!bVar1) {
      bVar1 = check<(anonymous_namespace)::ac>((path *)local_928);
      if (bVar1) {
        local_9e8 = (directory_iterator **)&failed;
      }
      else {
        local_9e8 = &__range3;
      }
      in_RCX = (directory_iterator *)((long)&((*local_9e8)->_M_dir)._M_ptr + 1);
      *local_9e8 = in_RCX;
    }
    std::filesystem::__cxx11::path::~path((path *)local_928);
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_8c0);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_8e0)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_8c0)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_888);
  input_file_path_1._M_cmpts = (_List)0x1;
  input_file_path_1._33_7_ = 0;
  for (; (ulong)input_file_path_1._32_8_ <= small_gen_num;
      input_file_path_1._32_8_ = input_file_path_1._32_8_ + 1) {
    small_genfile_path_abi_cxx11_
              ((path *)&index_1,(unit_test<libtest::a_plus_b> *)input_file_path_1._32_8_,1,
               SUB81(in_RCX,0));
    bVar1 = check<(anonymous_namespace)::ac>((path *)&index_1);
    if (bVar1) {
      local_9f8 = (directory_iterator **)&failed;
    }
    else {
      local_9f8 = &__range3;
    }
    in_RCX = (directory_iterator *)((long)&((*local_9f8)->_M_dir)._M_ptr + 1);
    *local_9f8 = in_RCX;
    std::filesystem::__cxx11::path::~path((path *)&index_1);
  }
  input_file_path_2._M_cmpts = (_List)0x1;
  input_file_path_2._33_7_ = 0;
  for (; (ulong)input_file_path_2._32_8_ <= large_gen_num;
      input_file_path_2._32_8_ = input_file_path_2._32_8_ + 1) {
    large_genfile_path_abi_cxx11_
              ((path *)local_9d8,(unit_test<libtest::a_plus_b> *)input_file_path_2._32_8_,1,
               SUB81(in_RCX,0));
    bVar1 = check<(anonymous_namespace)::ac>((path *)local_9d8);
    if (bVar1) {
      local_a08 = (directory_iterator **)&failed;
    }
    else {
      local_a08 = &__range3;
    }
    in_RCX = (directory_iterator *)((long)&((*local_a08)->_M_dir)._M_ptr + 1);
    *local_a08 = in_RCX;
    std::filesystem::__cxx11::path::~path((path *)local_9d8);
  }
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
            ((pair<unsigned_long,_unsigned_long> *)&small_gen_num_local,&failed,
             (unsigned_long *)&__range3);
  std::ofstream::~ofstream(&passed);
  std::ifstream::~ifstream(local_660);
  std::ifstream::~ifstream(local_448);
  std::ifstream::~ifstream(local_240);
  return _small_gen_num_local;
}

Assistant:

static std::pair<usize, usize> test(const usize small_gen_num, const usize large_gen_num)
    {
        cprintf(base_color, "[----------] "), cprintf(bold_message_color, "Run tests\n");
        std::ifstream input_file, generated_output_file, solution_output_file_in;
        std::ofstream solution_output_file;
        usize passed = 0, failed = 0;
        for (const fs::directory_entry& file : fs::directory_iterator(test_case_dir())) {  // 手で作ったテストケース
            const auto input_file_path = file.path();
            if (input_file_path.extension() != ".in") { continue; }
            (check<Solution>(input_file_path) ? passed : failed)++;
        }
        for (usize index = 1; index <= small_gen_num; index++) {
            const auto input_file_path = small_genfile_path(index, true);
            (check<Solution>(input_file_path) ? passed : failed)++;
        }
        for (usize index = 1; index <= large_gen_num; index++) {
            const auto input_file_path = large_genfile_path(index, true);
            (check<Solution>(input_file_path) ? passed : failed)++;
        }
        return {passed, failed};
    }